

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzD.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyzD::ChNodeFEAxyzD
          (ChNodeFEAxyzD *this,ChVector<double> *initial_pos,ChVector<double> *initial_dir)

{
  double dVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  ChVariablesGenericDiagonalMass *this_00;
  undefined1 auVar4 [16];
  ChVector<double> local_38;
  undefined1 auVar5 [32];
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0x138);
  *(undefined ***)&(this->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x18 =
       &PTR__ChLoadable_011504f8;
  local_38.m_data[0] = initial_pos->m_data[0];
  local_38.m_data[1] = initial_pos->m_data[1];
  local_38.m_data[2] = initial_pos->m_data[2];
  ChNodeFEAxyz::ChNodeFEAxyz
            (&this->super_ChNodeFEAxyz,&PTR_construction_vtable_32__011797a0,&local_38);
  (this->super_ChNodeFEAxyz).super_ChNodeFEAbase._vptr_ChNodeFEAbase = (_func_int **)0x1179350;
  *(undefined8 *)&this->field_0x138 = 0x11796e0;
  *(undefined8 *)&(this->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x18 = 0x1179540;
  (this->super_ChNodeFEAxyz).super_ChVariableTupleCarrier_1vars<3>.
  _vptr_ChVariableTupleCarrier_1vars = (_func_int **)(vtable + 0x2d8);
  *(double *)&(this->super_ChNodeFEAxyz).field_0xf0 = initial_dir->m_data[0];
  *(double *)&this->field_0xf8 = initial_dir->m_data[1];
  auVar3 = _VNULL;
  auVar4._8_8_ = DAT_011dd3e8;
  auVar4._0_8_ = DAT_011dd3e8;
  auVar5._16_8_ = DAT_011dd3e8;
  auVar5._0_16_ = auVar4;
  auVar5._24_8_ = DAT_011dd3e8;
  auVar2 = vpermpd_avx2(ZEXT1632(_VNULL),0xd0);
  auVar2 = vblendps_avx(auVar2,ZEXT832((ulong)initial_dir->m_data[2]),3);
  auVar2 = vblendps_avx(auVar2,auVar5,0xc0);
  *(undefined1 (*) [32])&this->field_0x100 = auVar2;
  *(undefined1 (*) [16])(this->D_dtdt).m_data = auVar3;
  dVar1 = (double)vmovlps_avx(auVar4);
  (this->D_dtdt).m_data[2] = dVar1;
  this_00 = (ChVariablesGenericDiagonalMass *)::operator_new(0x50);
  ChVariablesGenericDiagonalMass::ChVariablesGenericDiagonalMass(this_00,3);
  *(ChVariablesGenericDiagonalMass **)&(this->super_ChNodeFEAxyz).field_0xe8 = this_00;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this_00->MmassDiag);
  return;
}

Assistant:

ChNodeFEAxyzD::ChNodeFEAxyzD(ChVector<> initial_pos, ChVector<> initial_dir)
    : ChNodeFEAxyz(initial_pos), D(initial_dir), D_dt(VNULL), D_dtdt(VNULL) {
    variables_D = new ChVariablesGenericDiagonalMass(3);
    // default: no atomic mass associated to fea node, the fea element will add mass matrix
    variables_D->GetMassDiagonal().setZero();
}